

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O1

String * __thiscall
Rml::DataViewText::BuildText_abi_cxx11_(String *__return_storage_ptr__,DataViewText *this)

{
  pointer pDVar1;
  DataEntry *entry;
  pointer pDVar2;
  ulong uVar3;
  long *local_60 [2];
  long local_50 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  DataViewText *local_38;
  
  for (pDVar2 = (this->data_entries).
                super__Vector_base<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pDVar2 != (this->data_entries).
                super__Vector_base<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish; pDVar2 = pDVar2 + 1) {
  }
  local_40 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pDVar2 = (this->data_entries).
           super__Vector_base<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar1 = (this->data_entries).
           super__Vector_base<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = this;
  if (pDVar2 == pDVar1) {
    uVar3 = 0;
  }
  else {
    do {
      ::std::__cxx11::string::substr((ulong)local_60,(ulong)&this->text);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60[0]);
      if (local_60[0] != local_50) {
        operator_delete(local_60[0],local_50[0] + 1);
      }
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(pDVar2->value)._M_dataplus._M_p);
      uVar3 = pDVar2->index;
      pDVar2 = pDVar2 + 1;
    } while (pDVar2 != pDVar1);
  }
  if (uVar3 < (local_38->text)._M_string_length) {
    ::std::__cxx11::string::substr((ulong)local_60,(ulong)&this->text);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60[0]);
    if (local_60[0] != local_50) {
      operator_delete(local_60[0],local_50[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String DataViewText::BuildText() const
{
	size_t reserve_size = text.size();

	for (const DataEntry& entry : data_entries)
		reserve_size += entry.value.size();

	String result;
	result.reserve(reserve_size);

	size_t previous_index = 0;
	for (const DataEntry& entry : data_entries)
	{
		result += text.substr(previous_index, entry.index - previous_index);
		result += entry.value;
		previous_index = entry.index;
	}

	if (previous_index < text.size())
		result += text.substr(previous_index);

	return result;
}